

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::Value::swapPayload(Value *this,Value *other)

{
  undefined1 uVar1;
  ushort uVar2;
  ValueHolder VVar3;
  
  uVar1 = this->field_0x8;
  this->field_0x8 = other->field_0x8;
  other->field_0x8 = uVar1;
  VVar3 = this->value_;
  this->value_ = other->value_;
  other->value_ = VVar3;
  uVar2 = *(ushort *)&this->field_0x8;
  *(ushort *)&this->field_0x8 = uVar2 & 0xfeff | *(ushort *)&other->field_0x8 & 0x100;
  *(ushort *)&other->field_0x8 = (ushort)*(undefined4 *)&other->field_0x8 & 0xfeff | uVar2 & 0x100;
  return;
}

Assistant:

void Value::swapPayload(Value& other) {
  ValueType temp = type_;
  type_ = other.type_;
  other.type_ = temp;
  std::swap(value_, other.value_);
  int temp2 = allocated_;
  allocated_ = other.allocated_;
  other.allocated_ = temp2 & 0x1;
}